

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O2

void __thiscall helics::udp::UdpComms::loadNetworkInfo(UdpComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  promise<int> local_30;
  
  NetworkCommsInterface::loadNetworkInfo(&this->super_NetworkCommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
  if (bVar1) {
    std::promise<int>::promise(&local_30);
    std::promise<int>::operator=(&this->promisePort,&local_30);
    std::promise<int>::~promise(&local_30);
    std::__basic_future<int>::__basic_future
              ((__basic_future<int> *)&local_30,&(this->promisePort)._M_future);
    std::future<int>::operator=(&this->futurePort,(future<int> *)&local_30);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_30._M_future.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    CommsInterface::propertyUnLock((CommsInterface *)this);
  }
  return;
}

Assistant:

void UdpComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }

    promisePort = std::promise<int>();
    futurePort = promisePort.get_future();

    propertyUnLock();
}